

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParsePackage
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location,
          FileDescriptorProto *containing_file)

{
  ErrorCollector *pEVar1;
  ulong uVar2;
  bool bVar3;
  string *psVar4;
  undefined8 *puVar5;
  int iVar6;
  string identifier;
  LocationRecorder location;
  string local_68;
  LocationRecorder local_48;
  
  if (((file->_has_bits_).has_bits_[0] & 2) != 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Multiple package definitions.","");
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_68);
    }
    this->had_errors_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    internal::ArenaStringPtr::ClearToEmpty(&file->package_);
    *(byte *)(file->_has_bits_).has_bits_ = (byte)(file->_has_bits_).has_bits_[0] & 0xfd;
  }
  LocationRecorder::LocationRecorder(&local_48,root_location,2);
  LocationRecorder::RecordLegacyLocation(&local_48,&file->super_Message,NAME);
  bVar3 = Consume(this,"package");
  if (bVar3) {
    do {
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      bVar3 = ConsumeIdentifier(this,&local_68,"Expected identifier.");
      iVar6 = 1;
      if (bVar3) {
        *(byte *)(file->_has_bits_).has_bits_ = (byte)(file->_has_bits_).has_bits_[0] | 2;
        uVar2 = (file->super_Message).super_MessageLite._internal_metadata_.ptr_;
        puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          puVar5 = (undefined8 *)*puVar5;
        }
        psVar4 = internal::ArenaStringPtr::Mutable_abi_cxx11_(&file->package_,puVar5);
        std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_68._M_dataplus._M_p);
        bVar3 = TryConsume(this,".");
        iVar6 = 3;
        if (bVar3) {
          *(byte *)(file->_has_bits_).has_bits_ = (byte)(file->_has_bits_).has_bits_[0] | 2;
          uVar2 = (file->super_Message).super_MessageLite._internal_metadata_.ptr_;
          puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            puVar5 = (undefined8 *)*puVar5;
          }
          psVar4 = internal::ArenaStringPtr::Mutable_abi_cxx11_(&file->package_,puVar5);
          iVar6 = 0;
          std::__cxx11::string::append((char *)psVar4);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    } while (iVar6 == 0);
    if (iVar6 == 3) {
      bVar3 = ConsumeEndOfDeclaration(this,";",&local_48);
      goto LAB_003421a2;
    }
  }
  bVar3 = false;
LAB_003421a2:
  LocationRecorder::~LocationRecorder(&local_48);
  return bVar3;
}

Assistant:

bool Parser::ParsePackage(FileDescriptorProto* file,
                          const LocationRecorder& root_location,
                          const FileDescriptorProto* containing_file) {
  if (file->has_package()) {
    AddError("Multiple package definitions.");
    // Don't append the new package to the old one.  Just replace it.  Not
    // that it really matters since this is an error anyway.
    file->clear_package();
  }

  LocationRecorder location(root_location,
                            FileDescriptorProto::kPackageFieldNumber);
  location.RecordLegacyLocation(file, DescriptorPool::ErrorCollector::NAME);

  DO(Consume("package"));

  while (true) {
    std::string identifier;
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    file->mutable_package()->append(identifier);
    if (!TryConsume(".")) break;
    file->mutable_package()->append(".");
  }

  DO(ConsumeEndOfDeclaration(";", &location));

  return true;
}